

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_dither.c
# Opt level: O3

PaInt32 PaUtil_Generate16BitTriangularDither(PaUtilTriangularDitherGenerator *state)

{
  PaUint32 PVar1;
  PaUint32 PVar2;
  
  PVar1 = state->randSeed1 * 0xbb38435 + 0x3619636b;
  state->randSeed1 = PVar1;
  PVar2 = state->randSeed2 * 0xbb38435 + 0x3619636b;
  state->randSeed2 = PVar2;
  PVar2 = ((int)PVar2 >> 0x12) + ((int)PVar1 >> 0x12);
  PVar1 = state->previous;
  state->previous = PVar2;
  return PVar2 - PVar1;
}

Assistant:

PaInt32 PaUtil_Generate16BitTriangularDither( PaUtilTriangularDitherGenerator *state )
{
    PaInt32 current, highPass;

    /* Generate two random numbers. */
    state->randSeed1 = (state->randSeed1 * 196314165) + 907633515;
    state->randSeed2 = (state->randSeed2 * 196314165) + 907633515;

    /* Generate triangular distribution about 0.
     * Shift before adding to prevent overflow which would skew the distribution.
     * Also shift an extra bit for the high pass filter. 
     */
#define DITHER_SHIFT_  ((sizeof(PaInt32)*8 - PA_DITHER_BITS_) + 1)
	
    current = (((PaInt32)state->randSeed1)>>DITHER_SHIFT_) +
              (((PaInt32)state->randSeed2)>>DITHER_SHIFT_);

    /* High pass filter to reduce audibility. */
    highPass = current - state->previous;
    state->previous = current;
    return highPass;
}